

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O1

int main(void)

{
  GLFWcursor *cursorHandle;
  double dVar1;
  GLsizei GVar2;
  int iVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLint GVar7;
  GLFWcursor *pGVar8;
  GLFWwindow *handle;
  long lVar9;
  int iVar10;
  long lVar11;
  GLFWcursor **ppGVar12;
  char cVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  int fb_height;
  int fb_width;
  vec2 vertices [4];
  int wnd_width;
  int wnd_height;
  GLuint vertex_buffer;
  GLFWcursor *star_cursors [60];
  uchar buffer [4096];
  GLsizei local_42a0;
  GLsizei local_429c;
  undefined1 local_4298 [8];
  undefined8 local_4290;
  float local_4288;
  undefined4 local_4284;
  float local_4280;
  float local_427c;
  double local_4270;
  double local_4268;
  int local_425c;
  undefined1 local_4258 [16];
  int local_4240;
  GLuint local_423c;
  undefined1 local_4238 [16];
  undefined1 local_4228 [16];
  GLFWimage local_4218 [30];
  undefined4 local_4038;
  undefined8 local_4034;
  undefined8 uStack_402c;
  float local_4024;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 local_4010;
  float local_4008;
  float local_4004;
  undefined8 local_4000;
  
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 != 0) {
    local_4218[0].width = 0x20;
    local_4218[0].height = 0x20;
    local_4218[0].pixels = (uchar *)&local_4038;
    iVar3 = 0;
    lVar9 = 0;
    do {
      lVar9 = (long)(int)lVar9;
      iVar10 = 0x20;
      do {
        cVar13 = -(iVar10 == 0x19 || iVar3 == 7);
        *(char *)((long)&local_4038 + lVar9) = cVar13;
        *(undefined2 *)((long)&local_4038 + lVar9 + 1) = 0;
        *(char *)((long)&local_4038 + lVar9 + 3) = cVar13;
        lVar9 = lVar9 + 4;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x20);
    tracking_cursor = glfwCreateCursor(local_4218,7,7);
    if (tracking_cursor != (GLFWcursor *)0x0) {
      lVar9 = 0;
      do {
        local_4298._0_4_ = 0x40;
        local_4298._4_4_ = 0x40;
        local_4290 = (uchar *)&local_4038;
        local_4268 = (double)((float)(int)lVar9 / 60.0) * 6.283185307179586;
        iVar3 = 0;
        iVar10 = 0;
        do {
          if (0 < (int)local_4298._4_4_) {
            fVar15 = (float)iVar3 + -32.0;
            local_4258 = ZEXT416((uint)(fVar15 * fVar15));
            local_4238 = ZEXT416((uint)ABS(fVar15));
            lVar14 = (long)iVar10;
            lVar11 = 0;
            do {
              *(undefined2 *)((long)&local_4038 + lVar11 * 4 + lVar14) = 0xffff;
              *(undefined1 *)((long)&local_4038 + lVar11 * 4 + lVar14 + 2) = 0xff;
              dVar1 = sin(local_4268);
              fVar18 = (float)dVar1 * 0.25 + 0.75;
              fVar15 = (float)(int)lVar11 + -32.0;
              fVar16 = fVar15 * fVar15 + (float)local_4258._0_4_;
              if (fVar16 < 0.0) {
                local_4270 = (double)CONCAT44(local_4270._4_4_,fVar18);
                local_4228 = ZEXT416((uint)fVar15);
                fVar16 = sqrtf(fVar16);
                fVar15 = (float)local_4228._0_4_;
                fVar19 = local_4270._0_4_;
              }
              else {
                fVar16 = SQRT(fVar16);
                fVar19 = fVar18;
              }
              fVar17 = 32.0;
              if ((int)lVar11 != 0x20) {
                fVar17 = (fVar18 * 3.0) / ABS(fVar15);
              }
              fVar15 = 32.0;
              if (iVar3 != 0x20) {
                fVar15 = (fVar18 * 3.0) / (float)local_4238._0_4_;
              }
              fVar16 = fVar16 * -0.03125 + 1.0;
              dVar1 = (double)(fVar19 * fVar16 * 0.2 + fVar16 * fVar17 * fVar15);
              if (1.0 <= dVar1) {
                dVar1 = 1.0;
              }
              if (dVar1 <= 0.0) {
                dVar1 = 0.0;
              }
              *(char *)((long)&local_4038 + lVar11 * 4 + lVar14 + 3) =
                   (char)(int)((float)dVar1 * 255.0);
              iVar10 = iVar10 + 4;
              lVar11 = lVar11 + 1;
            } while ((int)lVar11 < (int)local_4298._4_4_);
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 < (int)local_4298._0_4_);
        pGVar8 = glfwCreateCursor((GLFWimage *)local_4298,(int)local_4298._0_4_ / 2,
                                  (int)local_4298._4_4_ / 2);
        *(GLFWcursor **)(&local_4218[0].width + lVar9 * 2) = pGVar8;
        if (pGVar8 == (GLFWcursor *)0x0) goto LAB_00114c44;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x3c);
      ppGVar12 = standard_cursors;
      lVar9 = 0;
      do {
        pGVar8 = glfwCreateStandardCursor(*(int *)((long)&DAT_0012e150 + lVar9));
        *ppGVar12 = pGVar8;
        if (pGVar8 == (GLFWcursor *)0x0) goto LAB_00114c44;
        lVar9 = lVar9 + 4;
        ppGVar12 = ppGVar12 + 1;
      } while (lVar9 != 0x18);
      glfwWindowHint(0x22002,2);
      glfwWindowHint(0x22003,0);
      handle = glfwCreateWindow(0x280,0x1e0,"Cursor Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle != (GLFWwindow *)0x0) {
        glfwMakeContextCurrent(handle);
        gladLoadGL(glfwGetProcAddress);
        (*glad_glGenBuffers)(1,&local_423c);
        (*glad_glBindBuffer)(0x8892,local_423c);
        GVar4 = (*glad_glCreateShader)(0x8b31);
        (*glad_glShaderSource)(GVar4,1,&vertex_shader_text,(GLint *)0x0);
        (*glad_glCompileShader)(GVar4);
        GVar5 = (*glad_glCreateShader)(0x8b30);
        (*glad_glShaderSource)(GVar5,1,&fragment_shader_text,(GLint *)0x0);
        (*glad_glCompileShader)(GVar5);
        GVar6 = (*glad_glCreateProgram)();
        (*glad_glAttachShader)(GVar6,GVar4);
        (*glad_glAttachShader)(GVar6,GVar5);
        (*glad_glLinkProgram)(GVar6);
        GVar7 = (*glad_glGetUniformLocation)(GVar6,"MVP");
        GVar4 = (*glad_glGetAttribLocation)(GVar6,"vPos");
        (*glad_glEnableVertexAttribArray)(GVar4);
        (*glad_glVertexAttribPointer)(GVar4,2,0x1406,'\0',8,(void *)0x0);
        (*glad_glUseProgram)(GVar6);
        glfwGetCursorPos(handle,&cursor_x,&cursor_y);
        printf("Cursor position: %f %f\n",SUB84(cursor_x,0),SUB84(cursor_y,0));
        glfwSetCursorPosCallback(handle,cursor_position_callback);
        glfwSetKeyCallback(handle,key_callback);
        iVar3 = glfwWindowShouldClose(handle);
        if (iVar3 == 0) {
          pGVar8 = (GLFWcursor *)0x0;
          do {
            (*glad_glClear)(0x4000);
            if (track_cursor != 0) {
              glfwGetWindowSize(handle,&local_425c,&local_4240);
              glfwGetFramebufferSize(handle,&local_429c,&local_42a0);
              (*glad_glViewport)(0,0,local_429c,local_42a0);
              GVar2 = local_42a0;
              local_4258._0_4_ = (float)local_429c;
              local_4270 = (double)local_42a0;
              local_4298._0_4_ = 0x3f000000;
              local_4268 = (double)((float)local_429c / (float)local_425c);
              dVar1 = floor(cursor_y * local_4268);
              fVar15 = (float)((local_4270 - dVar1) + -1.0 + 0.5);
              local_4298._4_4_ = fVar15;
              local_4290 = (uchar *)CONCAT44(fVar15,(float)local_4258._0_4_ + 0.5);
              dVar1 = floor(local_4268 * cursor_x);
              local_4288 = (float)dVar1 + 0.5;
              local_4284 = 0x3f000000;
              local_427c = (float)GVar2 + 0.5;
              local_4280 = local_4288;
              (*glad_glBufferData)(0x8892,0x20,local_4298,0x88e0);
              local_4008 = (float)local_429c;
              local_4004 = (float)local_42a0;
              local_4038 = 2.0 / local_4008;
              local_4034 = 0;
              uStack_402c = 0;
              local_4024 = 2.0 / local_4004;
              local_4020 = 0;
              uStack_4018 = 0;
              local_4010 = 0xc0000000;
              local_4008 = -local_4008 / local_4008;
              local_4004 = -local_4004 / local_4004;
              local_4000 = 0x3f800000bf800000;
              (*glad_glUniformMatrix4fv)(GVar7,1,'\0',(GLfloat *)&local_4038);
              (*glad_glDrawArrays)(1,0,4);
            }
            glfwSwapBuffers(handle);
            if (animate_cursor == 0) {
              pGVar8 = (GLFWcursor *)0x0;
            }
            else {
              dVar1 = glfwGetTime();
              cursorHandle = *(GLFWcursor **)
                              (&local_4218[0].width + (long)((int)(dVar1 * 30.0) % 0x3c) * 2);
              if (pGVar8 != cursorHandle) {
                glfwSetCursor(handle,cursorHandle);
                pGVar8 = cursorHandle;
              }
            }
            if (wait_events == 0) {
              glfwPollEvents();
            }
            else if (animate_cursor == 0) {
              glfwWaitEvents();
            }
            else {
              glfwWaitEventsTimeout(0.03333333333333333);
            }
            fflush(_stdout);
            iVar3 = glfwWindowShouldClose(handle);
          } while (iVar3 == 0);
        }
        glfwDestroyWindow(handle);
        lVar9 = 0;
        do {
          glfwDestroyCursor(*(GLFWcursor **)(&local_4218[0].width + lVar9 * 2));
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x3c);
        lVar9 = 0;
        do {
          glfwDestroyCursor(*(GLFWcursor **)((long)standard_cursors + lVar9));
          lVar9 = lVar9 + 8;
        } while (lVar9 != 0x30);
        glfwTerminate();
        exit(0);
      }
    }
LAB_00114c44:
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int i;
    GLFWwindow* window;
    GLFWcursor* star_cursors[CURSOR_FRAME_COUNT];
    GLFWcursor* current_frame = NULL;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    tracking_cursor = create_tracking_cursor();
    if (!tracking_cursor)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    for (i = 0;  i < CURSOR_FRAME_COUNT;  i++)
    {
        star_cursors[i] = create_cursor_frame(i / (float) CURSOR_FRAME_COUNT);
        if (!star_cursors[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }
    }

    for (i = 0;  i < sizeof(standard_cursors) / sizeof(standard_cursors[0]);  i++)
    {
        const int shapes[] = {
            GLFW_ARROW_CURSOR,
            GLFW_IBEAM_CURSOR,
            GLFW_CROSSHAIR_CURSOR,
            GLFW_HAND_CURSOR,
            GLFW_HRESIZE_CURSOR,
            GLFW_VRESIZE_CURSOR
        };

        standard_cursors[i] = glfwCreateStandardCursor(shapes[i]);
        if (!standard_cursors[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(640, 480, "Cursor Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vec2), (void*) 0);
    glUseProgram(program);

    glfwGetCursorPos(window, &cursor_x, &cursor_y);
    printf("Cursor position: %f %f\n", cursor_x, cursor_y);

    glfwSetCursorPosCallback(window, cursor_position_callback);
    glfwSetKeyCallback(window, key_callback);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        if (track_cursor)
        {
            int wnd_width, wnd_height, fb_width, fb_height;
            float scale;
            vec2 vertices[4];
            mat4x4 mvp;

            glfwGetWindowSize(window, &wnd_width, &wnd_height);
            glfwGetFramebufferSize(window, &fb_width, &fb_height);

            glViewport(0, 0, fb_width, fb_height);

            scale = (float) fb_width / (float) wnd_width;
            vertices[0][0] = 0.5f;
            vertices[0][1] = (float) (fb_height - floor(cursor_y * scale) - 1.f + 0.5f);
            vertices[1][0] = (float) fb_width + 0.5f;
            vertices[1][1] = (float) (fb_height - floor(cursor_y * scale) - 1.f + 0.5f);
            vertices[2][0] = (float) floor(cursor_x * scale) + 0.5f;
            vertices[2][1] = 0.5f;
            vertices[3][0] = (float) floor(cursor_x * scale) + 0.5f;
            vertices[3][1] = (float) fb_height + 0.5f;

            glBufferData(GL_ARRAY_BUFFER,
                         sizeof(vertices),
                         vertices,
                         GL_STREAM_DRAW);

            mat4x4_ortho(mvp, 0.f, (float) fb_width, 0.f, (float) fb_height, 0.f, 1.f);
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);

            glDrawArrays(GL_LINES, 0, 4);
        }

        glfwSwapBuffers(window);

        if (animate_cursor)
        {
            const int i = (int) (glfwGetTime() * 30.0) % CURSOR_FRAME_COUNT;
            if (current_frame != star_cursors[i])
            {
                glfwSetCursor(window, star_cursors[i]);
                current_frame = star_cursors[i];
            }
        }
        else
            current_frame = NULL;

        if (wait_events)
        {
            if (animate_cursor)
                glfwWaitEventsTimeout(1.0 / 30.0);
            else
                glfwWaitEvents();
        }
        else
            glfwPollEvents();

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwDestroyWindow(window);

    for (i = 0;  i < CURSOR_FRAME_COUNT;  i++)
        glfwDestroyCursor(star_cursors[i]);

    for (i = 0;  i < sizeof(standard_cursors) / sizeof(standard_cursors[0]);  i++)
        glfwDestroyCursor(standard_cursors[i]);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}